

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  int iVar2;
  long lVar3;
  iterator __position;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int new_index;
  FieldDescriptor *local_20;
  int local_14;
  
  local_20 = field;
  if (*(char *)((long)this + 0x40) == '\0') {
    if (*(long **)((long)this + 0x48) == *(long **)((long)this + 0x50)) goto LAB_002b15a2;
    lVar3 = **(long **)((long)this + 0x48);
    lVar5 = 0;
    lVar6 = 0;
    if ((*(byte *)(lVar3 + 1) & 0x10) != 0) {
      lVar6 = *(long *)(lVar3 + 0x28);
    }
    if (((byte)field[1] & 0x10) != 0) {
      lVar5 = *(long *)(field + 0x28);
    }
    if (lVar6 == lVar5) goto LAB_002b15a2;
  }
  GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush((LazySerializerEmitter *)this);
LAB_002b15a2:
  FVar1 = local_20[1];
  lVar3 = *(long *)(local_20 + 0x28);
  if ((lVar3 == 0 || ((byte)FVar1 & 0x10) == 0) ||
     ((*(int *)(lVar3 + 4) == 1 &&
      ((byte)(lVar3 == 0 | (*(byte *)(*(long *)(lVar3 + 0x20) + 1) & 2) >> 1) == 1)))) {
    if (((~(byte)FVar1 & 0x60) != 0) &&
       ((*(char *)(*(long *)(local_20 + 0x38) + 0x4f) == '\0' &&
        (*(char *)((long)this + 0x40) == '\0')))) {
      lVar6 = 0x10;
      if (lVar3 != 0) {
        lVar6 = 0x28;
      }
      uVar7 = (ulong)(lVar3 == 0) << 5 | 0x50;
      if (((byte)FVar1 & 8) == 0) {
        uVar7 = 0x28;
        lVar6 = 0x20;
      }
      iVar2 = *(int *)(*(long *)(*this + 0x158) +
                      (long)((int)((ulong)((long)local_20 -
                                          *(long *)(*(long *)(local_20 + lVar6) + uVar7)) >> 3) *
                            0x38e38e39) * 4);
      iVar4 = iVar2 + 0x1f;
      if (-1 < iVar2) {
        iVar4 = iVar2;
      }
      if (*(int *)((long)this + 0x60) != iVar4 >> 5) {
        local_14 = iVar4 >> 5;
        Formatter::operator()
                  ((Formatter *)((long)this + 8),"cached_has_bits = _has_bits_[$1$];\n",&local_14);
        *(int *)((long)this + 0x60) = local_14;
      }
    }
    GenerateSerializeOneField
              (*this,*(Printer **)((long)this + 8),local_20,*(int *)((long)this + 0x60));
  }
  else {
    __position._M_current = *(FieldDescriptor ***)((long)this + 0x50);
    if (__position._M_current == *(FieldDescriptor ***)((long)this + 0x58)) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)((long)this + 0x48),__position,&local_20);
    }
    else {
      *__position._M_current = local_20;
      *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
    }
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (!field->real_containing_oneof()) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            format_("cached_has_bits = _has_bits_[$1$];\n", new_index);

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(format_.printer(), field,
                                       cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }